

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O3

void __thiscall TCPListener::start(TCPListener *this,Address address,int backlogLength)

{
  int iVar1;
  int *piVar2;
  TCPListenerError *pTVar3;
  int enable;
  undefined4 local_d4;
  undefined1 local_d0 [16];
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_d0._8_8_ = address.sin_zero;
  local_d0._0_8_ = address._0_8_;
  if (backlogLength < 1) {
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"TCPListener\'s queue cannot be shorter than 1","");
    TCPListenerError::TCPListenerError(pTVar3,&local_40,0);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  this->backlogLength = backlogLength;
  if (this->listening != false) {
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"TCPListener is already listening","");
    TCPListenerError::TCPListenerError(pTVar3,&local_c0,0);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  iVar1 = bind((this->super_Socket).socketDescriptor,(sockaddr *)local_d0,0x10);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Could not bind","");
    TCPListenerError::TCPListenerError(pTVar3,&local_60,iVar1);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  local_d4 = 1;
  iVar1 = setsockopt((this->super_Socket).socketDescriptor,1,2,&local_d4,4);
  if (-1 < iVar1) {
    iVar1 = listen((this->super_Socket).socketDescriptor,backlogLength);
    if (-1 < iVar1) {
      this->listening = true;
      return;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"Could not start listening","");
    TCPListenerError::TCPListenerError(pTVar3,&local_a0,iVar1);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Could not setup address reusing for TCPListener","");
  TCPListenerError::TCPListenerError(pTVar3,&local_80,iVar1);
  __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
}

Assistant:

void TCPListener::start(Address address, int backlogLength)
{
    if(backlogLength < 1){
        throw TCPListenerError("TCPListener's queue cannot be shorter than 1");
    }
    this->backlogLength = backlogLength;

    if(!listening)
    {
        if(::bind(socketDescriptor, (sockaddr*)&address, sizeof(address)) < 0)
        {
            int x = errno;
            throw TCPListenerError("Could not bind", x);
        }

        int enable = 1;
        int status = setsockopt(socketDescriptor, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int));
        if (status < 0){
            int x = errno;
            throw TCPListenerError("Could not setup address reusing for TCPListener", x);
        }

        if(::listen(socketDescriptor, backlogLength) < 0)
        {
            int x = errno;
            throw TCPListenerError("Could not start listening", x);
        }

        listening = true;
    }
    else
    {
        throw TCPListenerError("TCPListener is already listening");
    }
}